

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cout,"stable");
  poVar1 = std::operator<<((ostream *)&std::cout," version of boost.di [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x82);
  poVar1 = std::operator<<(poVar1,"]");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
#if (BOOST_DI_VERSION >= 1'0'0)
  std::cout << "stable";
#else
  std::cout << "unstable";
#endif
  std::cout << " version of boost.di [" << BOOST_DI_VERSION << "]" << std::endl;
}